

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

void __thiscall
slang::ast::DistVarVisitor::visit<slang::ast::NewCovergroupExpression>
          (DistVarVisitor *this,NewCovergroupExpression *expr)

{
  ExpressionKind EVar1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_00;
  RandMode RVar4;
  Symbol *symbol;
  long lVar5;
  
  EVar1 = (expr->super_Expression).kind;
  if ((EVar1 < Call) && ((0x1c0300U >> (EVar1 & ValueRange) & 1) != 0)) {
    symbol = Expression::getSymbolReference(&expr->super_Expression,true);
    if (symbol != (Symbol *)0x0) {
      RVar4 = ASTContext::getRandMode(this->context,symbol);
      if (RVar4 == RandC) {
        ASTContext::addDiag(this->context,(DiagCode)0x380008,(expr->super_Expression).sourceRange);
        return;
      }
      if (RVar4 == Rand) {
        this->anyRandVars = true;
      }
    }
  }
  else {
    sVar2 = (expr->arguments)._M_extent._M_extent_value;
    if (sVar2 != 0) {
      ppEVar3 = (expr->arguments)._M_ptr;
      lVar5 = 0;
      do {
        this_00 = *(Expression **)((long)ppEVar3 + lVar5);
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                  (this_00,this_00,this);
        lVar5 = lVar5 + 8;
      } while (sVar2 << 3 != lVar5);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                case ExpressionKind::MemberAccess:
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect: {
                    if (auto sym = expr.getSymbolReference()) {
                        RandMode mode = context.getRandMode(*sym);
                        if (mode == RandMode::Rand)
                            anyRandVars = true;
                        else if (mode == RandMode::RandC)
                            context.addDiag(diag::RandCInDist, expr.sourceRange);
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, DistVarVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }